

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error asmjit::Logging::formatRegister
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                uint32_t regType,uint32_t regId)

{
  long lVar1;
  Error EVar2;
  undefined8 in_RAX;
  ulong uVar3;
  byte extraout_DL;
  char *pcVar4;
  char *pcVar5;
  uint32_t uVar6;
  
  if (regId < 0x100) {
    if (regType < 0x20) {
      uVar3 = (ulong)regType;
      if (regId < (byte)x86RegFormatInfo[uVar3 * 4 + 3]) {
        pcVar5 = x86RegFormatStrings +
                 (ulong)regId * 4 + (ulong)(byte)x86RegFormatInfo[uVar3 * 4 + 2];
LAB_00123f33:
        EVar2 = StringBuilder::_opString(sb,1,pcVar5,0xffffffffffffffff);
        return EVar2;
      }
      if (regId < (byte)x86RegFormatInfo[uVar3 * 4]) {
        pcVar5 = x86RegFormatStrings + (byte)x86RegFormatInfo[uVar3 * 4 + 1];
        pcVar4 = (char *)(ulong)regId;
LAB_00123f83:
        EVar2 = StringBuilder::appendFormat(sb,pcVar5,pcVar4,in_RAX);
        return EVar2;
      }
    }
    pcVar5 = "PhysReg<Type=%u Id=%u>";
  }
  else {
    if (((emitter != (CodeEmitter *)0x0) && (emitter->_type == '\x03')) &&
       (pcVar4 = (char *)(ulong)(regId - 0x100), pcVar4 < emitter[3]._inlineComment)) {
      if (regId == 0xffffffff) {
        X86Logging::formatRegister();
      }
      else {
        lVar1 = *(long *)(*(long *)&emitter[3]._globalOptions + (long)pcVar4 * 8);
        if (lVar1 != 0) {
          pcVar5 = *(char **)(lVar1 + 8);
          if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
            pcVar5 = "v%u";
            goto LAB_00123f83;
          }
          goto LAB_00123f33;
        }
      }
      X86Logging::formatRegister();
      EVar2 = StringBuilder::_opChar(sb,1,'<');
      if (EVar2 != 0) {
        return EVar2;
      }
      if (archType != 0) {
        uVar6 = 0;
        do {
          if ((uVar6 != 0) && (EVar2 = StringBuilder::_opChar(sb,1,'|'), EVar2 != 0)) {
            return EVar2;
          }
          EVar2 = StringBuilder::_opNumber
                            (sb,1,(ulong)(logOptions & ~(-1 << (extraout_DL & 0x1f))),0,0,0);
          if (EVar2 != 0) {
            return EVar2;
          }
          uVar6 = uVar6 + 1;
          logOptions = logOptions >> (extraout_DL & 0x1f);
        } while (archType != uVar6);
      }
      EVar2 = StringBuilder::_opChar(sb,1,'>');
      return EVar2;
    }
    pcVar5 = "VirtReg<Type=%u Id=%u>";
  }
  EVar2 = StringBuilder::appendFormat(sb,pcVar5,regType,(ulong)regId,in_RAX);
  return EVar2;
}

Assistant:

Error Logging::formatRegister(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  uint32_t regType,
  uint32_t regId) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatRegister(sb, logOptions, emitter, archType, regType, regId);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatRegister(sb, logOptions, emitter, archType, regType, regId);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}